

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntGrow(Vec_Int_t *p,int nCapMin)

{
  int *local_20;
  int nCapMin_local;
  Vec_Int_t *p_local;
  
  if (p->nCap < nCapMin) {
    if (p->pArray == (int *)0x0) {
      local_20 = (int *)malloc((long)nCapMin << 2);
    }
    else {
      local_20 = (int *)realloc(p->pArray,(long)nCapMin << 2);
    }
    p->pArray = local_20;
    if (p->pArray == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p->nCap = nCapMin;
  }
  return;
}

Assistant:

static inline void Vec_IntGrow( Vec_Int_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    p->pArray = ABC_REALLOC( int, p->pArray, nCapMin ); 
    assert( p->pArray );
    p->nCap   = nCapMin;
}